

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O0

char * __thiscall strict_fstream::strerror_abi_cxx11_(strict_fstream *this,int __errnum)

{
  int *piVar1;
  vector<char,_std::allocator<char>_> *this_00;
  size_type __buflen;
  char *__s;
  size_t sVar2;
  char *p;
  vector<char,_std::allocator<char>_> buff;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  int __errnum_00;
  value_type_conflict *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator local_41;
  char *local_40;
  allocator<char> local_22;
  undefined1 local_21;
  vector<char,_std::allocator<char>_> local_20;
  strict_fstream *local_8;
  
  local_21 = 0;
  local_8 = this;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::allocator<char>::~allocator(&local_22);
  piVar1 = __errno_location();
  __errnum_00 = *piVar1;
  this_00 = (vector<char,_std::allocator<char>_> *)
            std::vector<char,_std::allocator<char>_>::operator[](&local_20,0);
  __buflen = std::vector<char,_std::allocator<char>_>::size(&local_20);
  __s = strerror_r(__errnum_00,(char *)this_00,__buflen);
  local_40 = __s;
  sVar2 = strlen(__s);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,__s,sVar2,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::vector<char,_std::allocator<char>_>::~vector(this_00);
  return (char *)this;
}

Assistant:

static std::string strerror()
{
    // Can't use std::string since we're pre-C++17
    std::vector<char> buff(256, '\0');

#ifdef _WIN32
    // Since strerror_s might set errno itself, we need to store it.
    const int err_num = errno;
    if (strerror_s(buff.data(), buff.size(), err_num) != 0) {
        return trim_to_null(buff);
    } else {
        return "Unknown error (" + std::to_string(err_num) + ")";
    }
#elif ((_POSIX_C_SOURCE >= 200112L || _XOPEN_SOURCE >= 600 || defined(__APPLE__) || defined(__FreeBSD__) || defined(__OpenBSD__)) && ! _GNU_SOURCE) || defined(__MUSL__)
// XSI-compliant strerror_r()
    const int err_num = errno; // See above
    if (strerror_r(err_num, buff.data(), buff.size()) == 0) {
        return trim_to_null(buff);
    } else {
        return "Unknown error (" + std::to_string(err_num) + ")";
    }
#else
// GNU-specific strerror_r()
    char * p = strerror_r(errno, &buff[0], buff.size());
    return std::string(p, std::strlen(p));
#endif
}